

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

pointer poly::
        delegate_cloning_policy<Interface,_std::allocator<Interface>,_std::integral_constant<bool,_true>_>
        ::clone_func<Impl1>(allocator<Interface> *a,pointer obj,void_pointer dest,Operation op)

{
  Impl1 *pIVar1;
  allocator<Impl1> local_25;
  Operation local_24;
  allocator_type alloc;
  Impl1 *pIStack_20;
  Operation op_local;
  void_pointer dest_local;
  pointer obj_local;
  allocator<Interface> *a_local;
  
  local_24 = op;
  pIStack_20 = (Impl1 *)dest;
  std::allocator<Impl1>::allocator<Interface>(&local_25,a);
  if (local_24 == Clone) {
    std::allocator_traits<std::allocator<Impl1>>::construct<Impl1,Impl1_const&>
              (&local_25,pIStack_20,(Impl1 *)obj);
  }
  else {
    std::allocator_traits<std::allocator<Impl1>>::construct<Impl1,Impl1>
              (&local_25,pIStack_20,(Impl1 *)obj);
  }
  pIVar1 = pIStack_20;
  std::allocator<Impl1>::~allocator(&local_25);
  return &pIVar1->super_Interface;
}

Assistant:

static pointer clone_func(const Allocator& a, pointer obj, void_pointer dest, Operation op)
    {
        using traits      = typename std::allocator_traits<Allocator>::template rebind_traits<T>;
        using obj_pointer = typename traits::pointer;
        using obj_const_pointer = typename traits::const_pointer;

        typename traits::allocator_type alloc(a);
        if (op == Clone) {
            traits::construct(
                alloc, static_cast<obj_pointer>(dest), *static_cast<obj_const_pointer>(obj));
        } else {
            traits::construct(
                alloc, static_cast<obj_pointer>(dest), std::move(*static_cast<obj_pointer>(obj)));
        }
        return static_cast<obj_pointer>(dest);
    }